

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# converter.cpp
# Opt level: O0

string * __thiscall
booster::locale::impl_posix::utf8_converter::convert_abi_cxx11_
          (utf8_converter *this,conversion_type how,char *begin,char *end,int param_5)

{
  wint_t __wc;
  wchar_t wVar1;
  wint_t *pwVar2;
  ulong uVar3;
  element_type *pp_Var4;
  ulong uVar5;
  char *in_RCX;
  int in_EDX;
  string *in_RDI;
  long in_R8;
  uint i_1;
  wstring wres_1;
  wstring tmp_1;
  uint i;
  wstring wres;
  wstring tmp;
  __shared_ptr_access<__locale_struct_*,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  *in_stack_fffffffffffffde0;
  undefined8 in_stack_fffffffffffffdf0;
  method_type mVar7;
  allocator *paVar6;
  string *in_stack_fffffffffffffdf8;
  undefined4 in_stack_fffffffffffffe00;
  wint_t in_stack_fffffffffffffe04;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
  *in_stack_fffffffffffffe08;
  allocator local_16a;
  allocator local_169;
  string local_168 [36];
  uint local_144;
  wstring local_140 [39];
  allocator local_119;
  string local_118 [32];
  wstring local_f8 [39];
  allocator local_d1;
  string local_d0 [36];
  uint local_ac;
  wstring local_a8 [55];
  allocator local_71;
  string local_70 [32];
  wstring local_50 [80];
  
  mVar7 = (method_type)((ulong)in_stack_fffffffffffffdf0 >> 0x20);
  if (in_EDX == 1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_70,"UTF-8",&local_71);
    conv::to_utf<wchar_t>
              ((char *)in_stack_fffffffffffffe08,
               (char *)CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00),
               in_stack_fffffffffffffdf8,mVar7);
    std::__cxx11::string::~string(local_70);
    std::allocator<char>::~allocator((allocator<char> *)&local_71);
    std::__cxx11::wstring::wstring(local_a8);
    std::__cxx11::wstring::size();
    std::__cxx11::wstring::reserve((ulong)local_a8);
    local_ac = 0;
    while( true ) {
      uVar5 = (ulong)local_ac;
      uVar3 = std::__cxx11::wstring::size();
      mVar7 = (method_type)((ulong)in_stack_fffffffffffffdf8 >> 0x20);
      if (uVar3 <= uVar5) break;
      pwVar2 = (wint_t *)std::__cxx11::wstring::operator[]((ulong)local_50);
      __wc = *pwVar2;
      pp_Var4 = std::
                __shared_ptr_access<__locale_struct_*,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator*(in_stack_fffffffffffffde0);
      wVar1 = towupper_l(__wc,(__locale_t)*pp_Var4);
      std::__cxx11::wstring::operator+=(local_a8,wVar1);
      local_ac = local_ac + 1;
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_d0,"UTF-8",&local_d1);
    conv::from_utf<wchar_t>
              (in_stack_fffffffffffffe08,
               (string *)CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00),mVar7);
    std::__cxx11::string::~string(local_d0);
    std::allocator<char>::~allocator((allocator<char> *)&local_d1);
    std::__cxx11::wstring::~wstring(local_a8);
    std::__cxx11::wstring::~wstring(local_50);
  }
  else if (in_EDX - 2U < 2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_118,"UTF-8",&local_119);
    conv::to_utf<wchar_t>
              ((char *)in_stack_fffffffffffffe08,
               (char *)CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00),
               in_stack_fffffffffffffdf8,mVar7);
    std::__cxx11::string::~string(local_118);
    std::allocator<char>::~allocator((allocator<char> *)&local_119);
    std::__cxx11::wstring::wstring(local_140);
    std::__cxx11::wstring::size();
    std::__cxx11::wstring::reserve((ulong)local_140);
    local_144 = 0;
    while( true ) {
      uVar5 = (ulong)local_144;
      uVar3 = std::__cxx11::wstring::size();
      if (uVar3 <= uVar5) break;
      in_stack_fffffffffffffe08 =
           (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
           std::__cxx11::wstring::operator[]((ulong)local_f8);
      in_stack_fffffffffffffe04 = *(wint_t *)in_stack_fffffffffffffe08;
      pp_Var4 = std::
                __shared_ptr_access<__locale_struct_*,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator*(in_stack_fffffffffffffde0);
      wVar1 = towlower_l(in_stack_fffffffffffffe04,(__locale_t)*pp_Var4);
      std::__cxx11::wstring::operator+=(local_140,wVar1);
      local_144 = local_144 + 1;
    }
    paVar6 = &local_169;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_168,"UTF-8",paVar6);
    conv::from_utf<wchar_t>
              (in_stack_fffffffffffffe08,
               (string *)CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00),
               (method_type)((ulong)paVar6 >> 0x20));
    std::__cxx11::string::~string(local_168);
    std::allocator<char>::~allocator((allocator<char> *)&local_169);
    std::__cxx11::wstring::~wstring(local_140);
    std::__cxx11::wstring::~wstring(local_f8);
  }
  else {
    uVar5 = in_R8 - (long)in_RCX;
    paVar6 = &local_16a;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,in_RCX,uVar5,paVar6);
    std::allocator<char>::~allocator((allocator<char> *)&local_16a);
  }
  return in_RDI;
}

Assistant:

virtual std::string convert(converter_base::conversion_type how,char const *begin,char const *end,int /*flags*/ = 0) const 
    {
        switch(how) {
        case upper_case:
            {
                std::wstring tmp = conv::to_utf<wchar_t>(begin,end,"UTF-8");
                std::wstring wres;
                wres.reserve(tmp.size());
                for(unsigned i=0;i<tmp.size();i++)
                    wres+=towupper_l(tmp[i],*lc_);
                return conv::from_utf<wchar_t>(wres,"UTF-8");
            }
            
        case lower_case:
        case case_folding:
            {
                std::wstring tmp = conv::to_utf<wchar_t>(begin,end,"UTF-8");
                std::wstring wres;
                wres.reserve(tmp.size());
                for(unsigned i=0;i<tmp.size();i++)
                    wres+=towlower_l(tmp[i],*lc_);
                return conv::from_utf<wchar_t>(wres,"UTF-8");
            }
        default:
            return std::string(begin,end-begin);
        }
    }